

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

int __thiscall
testing::internal::UnitTestImpl::FilterTests(UnitTestImpl *this,ReactionToSharding shard_tests)

{
  pointer ppTVar1;
  TestInfo *pTVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  TestSuite *pTVar6;
  size_t j;
  ulong uVar7;
  int iVar8;
  bool bVar9;
  int local_9c;
  allocator<char> local_95;
  Int32 local_94;
  Int32 local_90;
  ReactionToSharding local_8c;
  pointer local_88;
  pointer local_80;
  TestSuite *local_78;
  string local_70;
  string test_name;
  
  local_8c = shard_tests;
  if (shard_tests == HONOR_SHARDING_PROTOCOL) {
    local_90 = Int32FromEnvOrDie("GTEST_TOTAL_SHARDS",-1);
    local_94 = Int32FromEnvOrDie("GTEST_SHARD_INDEX",-1);
  }
  else {
    local_94 = -1;
    local_90 = local_94;
  }
  local_88 = (this->test_suites_).
             super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl
             .super__Vector_impl_data._M_finish;
  iVar8 = 0;
  local_9c = 0;
  for (local_80 = (this->test_suites_).
                  super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; local_80 != local_88;
      local_80 = local_80 + 1) {
    pTVar6 = *local_80;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,(pTVar6->name_)._M_dataplus._M_p,(allocator<char> *)&test_name);
    pTVar6->should_run_ = false;
    local_78 = pTVar6;
    for (uVar7 = 0;
        ppTVar1 = (pTVar6->test_info_list_).
                  super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                  _M_impl.super__Vector_impl_data._M_start,
        uVar7 < (ulong)((long)(pTVar6->test_info_list_).
                              super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3);
        uVar7 = uVar7 + 1) {
      pTVar2 = ppTVar1[uVar7];
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&test_name,(pTVar2->name_)._M_dataplus._M_p,&local_95);
      bVar3 = UnitTestOptions::MatchesFilter(&local_70,"DISABLED_*:*/DISABLED_*");
      bVar4 = true;
      if (!bVar3) {
        bVar4 = UnitTestOptions::MatchesFilter(&test_name,"DISABLED_*:*/DISABLED_*");
      }
      pTVar2->is_disabled_ = bVar4;
      bVar3 = UnitTestOptions::FilterMatchesTest(&local_70,&test_name);
      pTVar6 = local_78;
      pTVar2->matches_filter_ = bVar3;
      bVar9 = local_9c % local_90 != local_94;
      bVar5 = bVar3 & (bVar4 ^ 1U | FLAGS_gtest_also_run_disabled_tests);
      pTVar2->is_in_another_shard_ = local_8c != IGNORE_SHARDING_PROTOCOL && bVar9;
      bVar3 = (bool)((local_8c == IGNORE_SHARDING_PROTOCOL || !bVar9) & bVar5);
      local_9c = local_9c + (uint)bVar5;
      iVar8 = iVar8 + (uint)bVar3;
      pTVar2->should_run_ = bVar3;
      local_78->should_run_ = (bool)(local_78->should_run_ | bVar3);
      std::__cxx11::string::_M_dispose();
    }
    std::__cxx11::string::_M_dispose();
  }
  return iVar8;
}

Assistant:

int UnitTestImpl::FilterTests(ReactionToSharding shard_tests) {
  const Int32 total_shards = shard_tests == HONOR_SHARDING_PROTOCOL ?
      Int32FromEnvOrDie(kTestTotalShards, -1) : -1;
  const Int32 shard_index = shard_tests == HONOR_SHARDING_PROTOCOL ?
      Int32FromEnvOrDie(kTestShardIndex, -1) : -1;

  // num_runnable_tests are the number of tests that will
  // run across all shards (i.e., match filter and are not disabled).
  // num_selected_tests are the number of tests to be run on
  // this shard.
  int num_runnable_tests = 0;
  int num_selected_tests = 0;
  for (auto* test_suite : test_suites_) {
    const std::string& test_suite_name = test_suite->name();
    test_suite->set_should_run(false);

    for (size_t j = 0; j < test_suite->test_info_list().size(); j++) {
      TestInfo* const test_info = test_suite->test_info_list()[j];
      const std::string test_name(test_info->name());
      // A test is disabled if test suite name or test name matches
      // kDisableTestFilter.
      const bool is_disabled = internal::UnitTestOptions::MatchesFilter(
                                   test_suite_name, kDisableTestFilter) ||
                               internal::UnitTestOptions::MatchesFilter(
                                   test_name, kDisableTestFilter);
      test_info->is_disabled_ = is_disabled;

      const bool matches_filter = internal::UnitTestOptions::FilterMatchesTest(
          test_suite_name, test_name);
      test_info->matches_filter_ = matches_filter;

      const bool is_runnable =
          (GTEST_FLAG(also_run_disabled_tests) || !is_disabled) &&
          matches_filter;

      const bool is_in_another_shard =
          shard_tests != IGNORE_SHARDING_PROTOCOL &&
          !ShouldRunTestOnShard(total_shards, shard_index, num_runnable_tests);
      test_info->is_in_another_shard_ = is_in_another_shard;
      const bool is_selected = is_runnable && !is_in_another_shard;

      num_runnable_tests += is_runnable;
      num_selected_tests += is_selected;

      test_info->should_run_ = is_selected;
      test_suite->set_should_run(test_suite->should_run() || is_selected);
    }
  }
  return num_selected_tests;
}